

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miner.cpp
# Opt level: O2

void __thiscall xmrig::MinerPrivate::getBackends(MinerPrivate *this,Value *reply,Document *doc)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  pointer ppIVar1;
  pointer ppIVar2;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_40;
  
  allocator = doc->allocator_;
  (reply->data_).n = (Number)0x0;
  (reply->data_).s.str = (Ch *)0x0;
  (reply->data_).f.flags = 4;
  ppIVar1 = (this->backends).
            super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppIVar2 = (this->backends).
                 super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppIVar2 != ppIVar1; ppIVar2 = ppIVar2 + 1) {
    (*(*ppIVar2)->_vptr_IBackend[0xd])(&local_40,*ppIVar2,doc);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack(reply,&local_40,allocator);
  }
  return;
}

Assistant:

void getBackends(rapidjson::Value &reply, rapidjson::Document &doc) const
    {
        using namespace rapidjson;
        auto &allocator = doc.GetAllocator();

        reply.SetArray();

        for (IBackend *backend : backends) {
            reply.PushBack(backend->toJSON(doc), allocator);
        }
    }